

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O3

void SUNDlsMat_bandScale(sunrealtype c,sunrealtype **a,sunindextype n,sunindextype mu,
                        sunindextype ml,sunindextype smu)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  
  if (0 < n) {
    lVar2 = 0;
    do {
      if (-1 < ml + mu) {
        psVar1 = a[lVar2];
        lVar3 = -mu;
        do {
          psVar1[smu + lVar3] = psVar1[smu + lVar3] * c;
          lVar3 = lVar3 + 1;
        } while (ml + 1 != lVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != n);
  }
  return;
}

Assistant:

void SUNDlsMat_bandScale(sunrealtype c, sunrealtype** a, sunindextype n,
                         sunindextype mu, sunindextype ml, sunindextype smu)
{
  sunindextype i, j, colSize;
  sunrealtype* col_j;

  colSize = mu + ml + 1;

  for (j = 0; j < n; j++)
  {
    col_j = a[j] + smu - mu;
    for (i = 0; i < colSize; i++) { col_j[i] *= c; }
  }
}